

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::AddDescriptors(DescriptorTable *table)

{
  int iVar1;
  long lVar2;
  
  if (*table->is_initialized == false) {
    *table->is_initialized = true;
    if (0 < table->num_sccs) {
      lVar2 = 0;
      do {
        if ((table->init_default_instances[lVar2]->visit_status).super___atomic_base<int>._M_i != 0)
        {
          InitSCCImpl(table->init_default_instances[lVar2]);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < table->num_sccs);
    }
    iVar1 = table->num_deps;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (table->deps[lVar2] != (DescriptorTable *)0x0) {
          AddDescriptors(table->deps[lVar2]);
          iVar1 = table->num_deps;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    DescriptorPool::InternalAddGeneratedFile(table->descriptor,table->size);
    MessageFactory::InternalRegisterGeneratedFile(table);
    return;
  }
  return;
}

Assistant:

void AddDescriptors(const DescriptorTable* table) {
  // AddDescriptors is not thread safe. Callers need to ensure calls are
  // properly serialized. This function is only called pre-main by global
  // descriptors and we can assume single threaded access or it's called
  // by AssignDescriptorImpl which uses a mutex to sequence calls.
  if (*table->is_initialized) return;
  *table->is_initialized = true;
  AddDescriptorsImpl(table);
}